

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConcatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  key_type *__k;
  bool bVar4;
  ConcatLayerParams *pCVar5;
  Type *pTVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  void **ppvVar9;
  _Rb_tree_header *p_Var10;
  long lVar11;
  string err;
  Result r;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,2,-1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar4 = Result::good(&r);
  if (bVar4) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  bVar4 = Result::good(&r);
  if ((bVar4) && (this->ndArrayInterpretation == true)) {
    std::__cxx11::string::string((string *)&local_50,"Concat",(allocator *)&local_b0);
    this_00 = &this->blobNameToRank;
    validateInputOutputRankEquality((Result *)&err,layer,&local_50,this_00);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    std::__cxx11::string::~string((string *)&local_50);
    bVar4 = Result::good(&r);
    if (bVar4) {
      pCVar5 = Specification::NeuralNetworkLayer::concat(layer);
      if (pCVar5->sequenceconcat_ == true) {
        std::__cxx11::string::string((string *)&local_b0,"Concat",(allocator *)&local_90);
        validateRankCount((Result *)&err,layer,&local_b0,5,-1,this_00);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&local_b0);
        bVar4 = Result::good(&r);
      }
      else {
        std::__cxx11::string::string((string *)&local_b0,"Concat",(allocator *)&local_90);
        validateRankCount((Result *)&err,layer,&local_b0,3,-1,this_00);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&local_b0);
        bVar4 = Result::good(&r);
      }
      if (bVar4 != false) {
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&(layer->input_).super_RepeatedPtrFieldBase,0);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,pTVar6);
        p_Var10 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar7._M_node != p_Var10) {
          pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(layer->input_).super_RepeatedPtrFieldBase,0);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_00,pTVar6);
          pRVar3 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
          ppvVar9 = pRVar3->elements;
          if (pRVar3 == (Rep *)0x0) {
            ppvVar9 = (void **)0x0;
          }
          iVar1 = *pmVar8;
          iVar2 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
          for (lVar11 = 0; (long)iVar2 * 8 != lVar11; lVar11 = lVar11 + 8) {
            __k = *(key_type **)((long)ppvVar9 + lVar11);
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find(&this_00->_M_t,__k);
            if (((_Rb_tree_header *)iVar7._M_node != p_Var10) &&
               (pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::at(this_00,__k), iVar1 != *pmVar8)) {
              err._M_dataplus._M_p = (pointer)&err.field_2;
              err._M_string_length = 0;
              err.field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::string((string *)&local_70,(string *)(layer->name_).ptr_);
              std::operator+(&local_90,"Layer \'",&local_70);
              std::operator+(&local_b0,&local_90,
                             "\' of type \'Concat\' expects equal ranks for its inputs, but they are not equal."
                            );
              std::__cxx11::string::operator=((string *)&err,(string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_70);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
              std::__cxx11::string::~string((string *)&err);
              goto LAB_0024fca3;
            }
          }
        }
      }
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_0024fca3:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConcatLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Concat", blobNameToRank);
        if (!r.good()) {return r;}
        if (layer.concat().sequenceconcat()) {
            r = validateRankCount(layer, "Concat", 5, -1, blobNameToRank);
            if (!r.good()) {return r;}
        } else {
            r = validateRankCount(layer, "Concat", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }

        // check that all inputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.input(0));
        } else {
            return r;
        }

        for (const auto& input : layer.input()) {
            if (blobNameToRank.find(input) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(input)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Concat' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}